

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode curl_multi_wakeup(Curl_multi *multi)

{
  CURLMcode CVar1;
  ssize_t sVar2;
  int *piVar3;
  char cVar4;
  char buf [1];
  undefined1 local_19;
  
  CVar1 = CURLM_BAD_HANDLE;
  if ((multi != (Curl_multi *)0x0) && (CVar1 = CURLM_BAD_HANDLE, multi->magic == 0xbab1e)) {
    if (multi->wakeup_pair[1] != -1) {
      local_19 = 1;
      do {
        sVar2 = write(multi->wakeup_pair[1],&local_19,1);
        if (-1 < sVar2) {
          return CURLM_OK;
        }
        piVar3 = __errno_location();
        cVar4 = *piVar3 != 0xb;
        if (*piVar3 == 4) {
          cVar4 = '\x02';
        }
      } while (cVar4 == '\x02');
      if (cVar4 == '\0') {
        return CURLM_OK;
      }
    }
    CVar1 = CURLM_WAKEUP_FAILURE;
  }
  return CVar1;
}

Assistant:

CURLMcode curl_multi_wakeup(struct Curl_multi *multi)
{
  /* this function is usually called from another thread,
     it has to be careful only to access parts of the
     Curl_multi struct that are constant */

  /* GOOD_MULTI_HANDLE can be safely called */
  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

#ifdef ENABLE_WAKEUP
#ifdef USE_WINSOCK
  if(WSASetEvent(multi->wsa_event))
    return CURLM_OK;
#else
  /* the wakeup_pair variable is only written during init and cleanup,
     making it safe to access from another thread after the init part
     and before cleanup */
  if(multi->wakeup_pair[1] != CURL_SOCKET_BAD) {
    char buf[1];
    buf[0] = 1;
    while(1) {
      /* swrite() is not thread-safe in general, because concurrent calls
         can have their messages interleaved, but in this case the content
         of the messages does not matter, which makes it ok to call.

         The write socket is set to non-blocking, this way this function
         cannot block, making it safe to call even from the same thread
         that will call curl_multi_wait(). If swrite() returns that it
         would block, it's considered successful because it means that
         previous calls to this function will wake up the poll(). */
      if(wakeup_write(multi->wakeup_pair[1], buf, sizeof(buf)) < 0) {
        int err = SOCKERRNO;
        int return_success;
#ifdef USE_WINSOCK
        return_success = WSAEWOULDBLOCK == err;
#else
        if(EINTR == err)
          continue;
        return_success = EWOULDBLOCK == err || EAGAIN == err;
#endif
        if(!return_success)
          return CURLM_WAKEUP_FAILURE;
      }
      return CURLM_OK;
    }
  }
#endif
#endif
  return CURLM_WAKEUP_FAILURE;
}